

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O2

bool isVt(string *str)

{
  ulong uVar1;
  __type _Var2;
  ulong uVar3;
  string *__rhs;
  
  __rhs = strVt_abi_cxx11_;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 0x20) break;
    _Var2 = std::operator==(str,__rhs);
    __rhs = __rhs + 1;
    uVar1 = uVar3 + 1;
  } while (!_Var2);
  return uVar3 < 0x20;
}

Assistant:

bool isVt(string &str) {
//    int len = strVt->length();//这样算出来的长度永远为1！！！！
    int len = sizeof(strVt) / sizeof(strVt[0]);
    for (int i = 0; i < len; i++) {
        if (str == strVt[i]) {
            return true;
        }
    }
    return false;
}